

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::Image::readLinear
          (Image *this,VkOffset3D offset,int width,int height,int depth,uint mipLevel,
          uint arrayElement,VkImageAspectFlagBits aspect,void *data)

{
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  int pixelSize;
  void *pvVar3;
  VkDeviceSize VVar4;
  TextureFormat local_d0;
  undefined8 local_c8;
  deInt32 local_c0;
  undefined8 local_b8;
  deInt32 local_b0;
  Allocation local_a0;
  void *local_80;
  deUint8 *srcPtr;
  long local_70;
  VkSubresourceLayout imageLayout;
  VkImageSubresource imageSubResource;
  int depth_local;
  int height_local;
  int width_local;
  Image *this_local;
  VkOffset3D offset_local;
  
  imageLayout.depthPitch._0_4_ = aspect;
  imageLayout.depthPitch._4_4_ = mipLevel;
  ::deMemset(&local_70,0,0x28);
  pDVar1 = this->m_vk;
  pVVar2 = this->m_device;
  srcPtr = (deUint8 *)object(this);
  (*pDVar1->_vptr_DeviceInterface[0x27])(pDVar1,pVVar2,srcPtr,&imageLayout.depthPitch,&local_70);
  getBoundMemory(&local_a0,this);
  pvVar3 = ::vk::Allocation::getHostPtr(&local_a0);
  ::vk::Allocation::~Allocation(&local_a0);
  local_c8 = offset._0_8_;
  local_c0 = offset.z;
  local_b8 = offset._0_8_;
  local_b0 = offset.z;
  local_80 = pvVar3;
  VVar4 = getPixelOffset(this,offset,imageLayout.size,imageLayout.arrayPitch,mipLevel,arrayElement);
  local_80 = (void *)(local_70 + VVar4 + (long)local_80);
  local_d0 = ::vk::mapVkFormat(this->m_format);
  pixelSize = tcu::TextureFormat::getPixelSize(&local_d0);
  MemoryOp::unpack(pixelSize,width,height,depth,imageLayout.size,imageLayout.arrayPitch,local_80,
                   data);
  return;
}

Assistant:

void Image::readLinear (vk::VkOffset3D				offset,
						int							width,
						int							height,
						int							depth,
						unsigned int				mipLevel,
						unsigned int				arrayElement,
						vk::VkImageAspectFlagBits	aspect,
						void *						data)
{
	vk::VkImageSubresource imageSubResource = { (vk::VkImageAspectFlags)aspect, mipLevel, arrayElement };

	vk::VkSubresourceLayout imageLayout;
	deMemset(&imageLayout, 0, sizeof(imageLayout));

	m_vk.getImageSubresourceLayout(m_device, object(), &imageSubResource, &imageLayout);

	const deUint8* srcPtr = reinterpret_cast<const deUint8*>(getBoundMemory().getHostPtr());
	srcPtr += imageLayout.offset + getPixelOffset(offset, imageLayout.rowPitch, imageLayout.depthPitch, mipLevel, arrayElement);

	MemoryOp::unpack(vk::mapVkFormat(m_format).getPixelSize(), width, height, depth,
		imageLayout.rowPitch, imageLayout.depthPitch, srcPtr, data);
}